

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::InitData<float>::
InitData<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (InitData<float> *this,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *rand)

{
  result_type rVar1;
  reference pvVar2;
  reference pvVar3;
  vector<float,_std::allocator<float>_> *in_RDI;
  uint32_t i;
  value_type in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  float local_64;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  vector<float,_std::allocator<float>_> *__n;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint local_2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_25;
  
  std::allocator<float>::allocator((allocator<float> *)0x25890c);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator_type *)in_stack_ffffffffffffffa0);
  std::allocator<float>::~allocator((allocator<float> *)0x25892c);
  __n = in_RDI + 1;
  this_00 = &local_25;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x258949);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,(size_type)__n,in_stack_ffffffffffffffa0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x258969);
  for (local_2c = 0; local_2c < 0x10000; local_2c = local_2c + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_64 = (float)rVar1;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(ulong)local_2c);
    *pvVar2 = local_64;
    in_stack_ffffffffffffff94 = local_2c;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 1),
                        (ulong)local_2c);
    *pvVar3 = in_stack_ffffffffffffff94;
    in_stack_ffffffffffffff90 = local_64;
  }
  return;
}

Assistant:

InitData(Rand& rand)
        : keys_(MAX_SIZE)
        , values_(MAX_SIZE)
    {
        for (uint32_t i = 0; i < MAX_SIZE; ++i)
        {
            keys_[i] = static_cast<KeyType>(rand());
            values_[i] = i;
        }
    }